

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O3

Read<int> __thiscall Omega_h::Mesh::sync_array<int>(Mesh *this,Int ent_dim,Read<int> *a,Int width)

{
  int *piVar1;
  Library *pLVar2;
  element_type *peVar3;
  Alloc *pAVar4;
  bool bVar5;
  long *plVar6;
  undefined4 in_register_0000000c;
  ulong *puVar7;
  element_type *peVar8;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  Library *pLVar9;
  Read<int> RVar10;
  ScopedTimer omega_h_scoped_function_timer;
  string __str;
  ScopedTimer local_1a5 [5];
  Library **local_1a0;
  long local_198;
  Library *local_190 [2];
  Alloc *local_180;
  ulong local_178;
  long *local_170 [2];
  long local_160 [2];
  undefined1 local_150 [24];
  void *pvStack_138;
  undefined1 local_c0 [24];
  void *pvStack_a8;
  
  puVar7 = (ulong *)CONCAT44(in_register_0000000c,width);
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_170,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_170);
  peVar3 = (element_type *)(local_c0 + 0x10);
  peVar8 = (element_type *)(plVar6 + 2);
  if ((element_type *)*plVar6 == peVar8) {
    local_c0._16_8_ = peVar8->library_;
    pvStack_a8 = (void *)plVar6[3];
    local_c0._0_8_ = peVar3;
  }
  else {
    local_c0._16_8_ = peVar8->library_;
    local_c0._0_8_ = (element_type *)*plVar6;
  }
  local_c0._8_8_ = plVar6[1];
  *plVar6 = (long)peVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct((ulong)&local_1a0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1a0,3,0x249);
  pLVar2 = (Library *)((long)(_func_int ***)local_c0._8_8_ + local_198);
  pLVar9 = (Library *)0xf;
  if ((element_type *)local_c0._0_8_ != peVar3) {
    pLVar9 = (Library *)local_c0._16_8_;
  }
  if (pLVar9 < pLVar2) {
    pLVar9 = (Library *)0xf;
    if (local_1a0 != local_190) {
      pLVar9 = local_190[0];
    }
    if (pLVar2 <= pLVar9) {
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,local_c0._0_8_)
      ;
      goto LAB_0032e805;
    }
  }
  plVar6 = (long *)std::__cxx11::string::_M_append(local_c0,(ulong)local_1a0);
LAB_0032e805:
  local_150._0_8_ = local_150 + 0x10;
  peVar8 = (element_type *)(plVar6 + 2);
  if ((element_type *)*plVar6 == peVar8) {
    local_150._16_8_ = peVar8->library_;
    pvStack_138 = (void *)plVar6[3];
  }
  else {
    local_150._16_8_ = peVar8->library_;
    local_150._0_8_ = (element_type *)*plVar6;
  }
  local_150._8_8_ = plVar6[1];
  *plVar6 = (long)peVar8;
  plVar6[1] = 0;
  *(undefined1 *)&peVar8->library_ = 0;
  begin_code("sync_array",(char *)local_150._0_8_);
  if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
    operator_delete((void *)local_150._0_8_,(ulong)((long)(LO *)local_150._16_8_ + 1));
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,(ulong)((long)&local_190[0]->self_send_threshold_ + 1));
  }
  if ((element_type *)local_c0._0_8_ != peVar3) {
    operator_delete((void *)local_c0._0_8_,(ulong)((long)(LO *)local_c0._16_8_ + 1));
  }
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  bVar5 = could_be_shared((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
  if (bVar5) {
    ask_dist((Dist *)local_c0,(Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
    Dist::invert((Dist *)local_150,(Dist *)local_c0);
    local_180 = (Alloc *)*puVar7;
    if (((ulong)local_180 & 7) == 0 && local_180 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_180 = (Alloc *)(local_180->size * 8 + 1);
      }
      else {
        local_180->use_count = local_180->use_count + 1;
      }
    }
    local_178 = puVar7[1];
    Dist::exch<int>((Dist *)this,(Read<int> *)local_150,(Int)&local_180);
    pAVar4 = local_180;
    if (((ulong)local_180 & 7) == 0 && local_180 != (Alloc *)0x0) {
      piVar1 = &local_180->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_180);
        operator_delete(pAVar4,0x48);
      }
    }
    Dist::~Dist((Dist *)local_150);
    Dist::~Dist((Dist *)local_c0);
  }
  else {
    plVar6 = (long *)*puVar7;
    *(long **)this = plVar6;
    (this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)puVar7[1];
    if ((((ulong)plVar6 & 7) == 0 && plVar6 != (long *)0x0) && (entering_parallel == '\x01')) {
      *(int *)(plVar6 + 6) = (int)plVar6[6] + -1;
      *(long *)this = *plVar6 * 8 + 1;
    }
    *puVar7 = 0;
    puVar7[1] = 0;
  }
  ScopedTimer::~ScopedTimer(local_1a5);
  RVar10.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar10.write_.shared_alloc_;
}

Assistant:

Read<T> Mesh::sync_array(Int ent_dim, Read<T> a, Int width) {
  OMEGA_H_TIME_FUNCTION;
  if (!could_be_shared(ent_dim)) return a;
  return ask_dist(ent_dim).invert().exch(a, width);
}